

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

SliceLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_slice(NeuralNetworkLayer *this)

{
  bool bVar1;
  SliceLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_slice(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_slice(this);
    this_00 = (SliceLayerParams *)operator_new(0x30);
    SliceLayerParams::SliceLayerParams(this_00);
    (this->layer_).slice_ = this_00;
  }
  return (SliceLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::SliceLayerParams* NeuralNetworkLayer::mutable_slice() {
  if (!has_slice()) {
    clear_layer();
    set_has_slice();
    layer_.slice_ = new ::CoreML::Specification::SliceLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.slice)
  return layer_.slice_;
}